

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

QList<MakefileGenerator::SubTarget_*> * __thiscall
MakefileGenerator::findSubDirsSubTargets
          (QList<MakefileGenerator::SubTarget_*> *__return_storage_ptr__,MakefileGenerator *this)

{
  long lVar1;
  QMakeProject *pQVar2;
  qsizetype qVar3;
  Data *pDVar4;
  QString file;
  QString *pQVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  ProStringList *pPVar10;
  parameter_type pSVar11;
  qsizetype qVar12;
  ProStringList *pPVar13;
  ProStringList *this_00;
  QString *pQVar14;
  ulong uVar15;
  char16_t *pcVar16;
  long lVar17;
  MakefileGenerator *pMVar18;
  int depend;
  ulong uVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffcc8;
  parameter_type pSVar21;
  QRegularExpression local_300 [8];
  QStringBuilder<const_char_(&)[5],_QString_&> local_2f8;
  ProString local_2e8;
  QArrayDataPointer<char16_t> local_2b8;
  ProKey dskey;
  QArrayDataPointer<char16_t> local_268;
  ProKey dfkey;
  ProKey tkey;
  QArrayDataPointer<char16_t> local_1e0;
  QArrayDataPointer<char16_t> local_1c8;
  ProKey dkey;
  QArrayDataPointer<char16_t> local_170;
  QArrayDataPointer<char16_t> local_158;
  ProKey mkey;
  ProKey skey;
  ProKey fkey;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  ProString ofile;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (SubTarget **)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar2 = this->project;
  ProKey::ProKey((ProKey *)&ofile,"SUBDIRS");
  pPVar10 = QMakeEvaluator::valuesRef(&pQVar2->super_QMakeEvaluator,(ProKey *)&ofile);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ofile);
  uVar15 = 0;
  do {
    if ((ulong)(pPVar10->super_QList<ProString>).d.size <= uVar15) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    ofile.m_file = -0x55555556;
    ofile._36_4_ = 0xaaaaaaaa;
    ofile.m_hash._0_4_ = 0xaaaaaaaa;
    ofile.m_hash._4_4_ = 0xaaaaaaaa;
    ofile.m_string.d.size._0_4_ = 0xaaaaaaaa;
    ofile.m_string.d.size._4_4_ = 0xaaaaaaaa;
    ofile.m_offset = -0x55555556;
    ofile.m_length = -0x55555556;
    ofile.m_string.d.d._0_4_ = 0xaaaaaaaa;
    ofile.m_string.d.d._4_4_ = 0xaaaaaaaa;
    ofile.m_string.d.ptr._0_4_ = 0xaaaaaaaa;
    ofile.m_string.d.ptr._4_4_ = 0xaaaaaaaa;
    ProString::ProString(&ofile,(pPVar10->super_QList<ProString>).d.ptr + uVar15);
    local_88.size = -0x5555555555555556;
    local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_88.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    ProString::toQString((QString *)&local_88,&ofile);
    local_a0.d = local_88.d;
    local_a0.ptr = local_88.ptr;
    local_a0.size = local_88.size;
    if (local_88.d != (Data *)0x0) {
      LOCK();
      ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::QString(&fkey.super_ProString.m_string,"[^a-zA-Z0-9_]");
    QRegularExpression::QRegularExpression
              ((QRegularExpression *)&mkey.super_ProString,&fkey.super_ProString,0);
    QString::QString(&skey.super_ProString.m_string,"-");
    QString::replace((QRegularExpression *)&local_a0,(QString *)&mkey.super_ProString);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&skey.super_ProString);
    QRegularExpression::~QRegularExpression((QRegularExpression *)&mkey.super_ProString);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&fkey.super_ProString);
    pSVar11 = (parameter_type)operator_new(0xa8);
    memset(pSVar11,0,0xa8);
    QString::operator=((QString *)pSVar11,(QString *)&local_88);
    QList<MakefileGenerator::SubTarget_*>::append(__return_storage_ptr__,pSVar11);
    fkey.super_ProString.m_file = -0x55555556;
    fkey.super_ProString._36_4_ = 0xaaaaaaaa;
    fkey.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
    fkey.super_ProString.m_string.d.size = -0x5555555555555556;
    fkey.super_ProString.m_offset = -0x55555556;
    fkey.super_ProString.m_length = -0x55555556;
    fkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    fkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    skey.super_ProString.m_string.d.ptr = L".file";
    skey.super_ProString.m_string.d.d = (Data *)&local_a0;
    ProString::ProString<QString&,char_const(&)[6]>
              (&fkey.super_ProString,
               (QStringBuilder<QString_&,_const_char_(&)[6]> *)&skey.super_ProString);
    skey.super_ProString.m_file = -0x55555556;
    skey.super_ProString._36_4_ = 0xaaaaaaaa;
    skey.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
    skey.super_ProString.m_string.d.size = -0x5555555555555556;
    skey.super_ProString.m_offset = -0x55555556;
    skey.super_ProString.m_length = -0x55555556;
    skey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    skey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    mkey.super_ProString.m_string.d.ptr = L".subdir";
    mkey.super_ProString.m_string.d.d = (Data *)&local_a0;
    ProString::ProString<QString&,char_const(&)[8]>
              (&skey.super_ProString,
               (QStringBuilder<QString_&,_const_char_(&)[8]> *)&mkey.super_ProString);
    pMVar18 = this;
    bVar7 = QMakeProject::isEmpty(this->project,(ProKey *)&fkey.super_ProString);
    bVar8 = QMakeProject::isEmpty(this->project,(ProKey *)&skey.super_ProString);
    if (bVar7) {
      if (bVar8) {
        bVar7 = ProString::endsWith(&ofile,&Option::pro_ext,CaseSensitive);
        local_158.size = -0x5555555555555556;
        local_158.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_158.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        ProString::toQString(&mkey.super_ProString.m_string,&ofile);
        Option::fixPathToTargetOS((QString *)&local_158,&mkey.super_ProString.m_string,true,true);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&mkey.super_ProString);
        this = pMVar18;
        if (bVar7) goto LAB_00153239;
      }
      else {
        QMakeEvaluator::first(&mkey.super_ProString,&pMVar18->project->super_QMakeEvaluator,&skey);
        ProString::operator=(&ofile,&mkey.super_ProString);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&mkey.super_ProString);
        local_158.size = -0x5555555555555556;
        local_158.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_158.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        ProString::toQString(&mkey.super_ProString.m_string,&ofile);
        Option::fixPathToTargetOS((QString *)&local_158,&mkey.super_ProString.m_string,true,true);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&mkey.super_ProString);
        this = pMVar18;
      }
      if (local_158.size == 0) {
LAB_00153531:
        pSVar21 = pSVar11;
        QString::operator=(&pSVar11->in_directory,(QString *)&local_158);
        goto LAB_0015354a;
      }
      pQVar2 = this->project;
      QString::QString((QString *)&mkey,"subdir_first_pro");
      bVar7 = QMakeProject::isActiveConfig(pQVar2,(QString *)&mkey,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&mkey);
      if (bVar7) goto LAB_00153531;
      mkey.super_ProString.m_string.d.size = -0x5555555555555556;
      mkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      mkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QString::section(&mkey,&local_158,&Option::dir_sep,0xffffffffffffffff,0xffffffffffffffff,0);
      qVar12 = mkey.super_ProString.m_string.d.size;
      if (mkey.super_ProString.m_string.d.size == 0) {
        ProString::toLatin1((QByteArray *)&dkey,(pPVar10->super_QList<ProString>).d.ptr + uVar15);
        pcVar16 = dkey.super_ProString.m_string.d.ptr;
        if (dkey.super_ProString.m_string.d.ptr == (char16_t *)0x0) {
          pcVar16 = (char16_t *)&QByteArray::_empty;
        }
        warn_msg(WarnLogic,"Ignoring invalid SUBDIRS entry %s",pcVar16);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&dkey);
      }
      else {
        tkey.super_ProString.m_string.d.ptr = (char16_t *)&Option::pro_ext;
        tkey.super_ProString.m_string.d.d = (Data *)&mkey;
        QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                  ((QString *)&dkey,(QStringBuilder<const_QString_&,_QString_&> *)&tkey);
        pDVar4 = (pSVar11->profile).d.d;
        pcVar16 = (pSVar11->profile).d.ptr;
        (pSVar11->profile).d.d = dkey.super_ProString.m_string.d.d;
        (pSVar11->profile).d.ptr = dkey.super_ProString.m_string.d.ptr;
        qVar3 = (pSVar11->profile).d.size;
        (pSVar11->profile).d.size = dkey.super_ProString.m_string.d.size;
        dkey.super_ProString.m_string.d.d = pDVar4;
        dkey.super_ProString.m_string.d.ptr = pcVar16;
        dkey.super_ProString.m_string.d.size = qVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dkey);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&mkey);
      if (qVar12 != 0) goto LAB_00153531;
    }
    else {
      this = pMVar18;
      if (!bVar8) {
        ProString::toLatin1((QByteArray *)&mkey.super_ProString,
                            (pPVar10->super_QList<ProString>).d.ptr + uVar15);
        pcVar16 = mkey.super_ProString.m_string.d.ptr;
        if (mkey.super_ProString.m_string.d.ptr == (char16_t *)0x0) {
          pcVar16 = (char16_t *)&QByteArray::_empty;
        }
        warn_msg(WarnLogic,"Cannot assign both file and subdir for subdir %s",pcVar16);
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)&mkey.super_ProString);
      }
      QMakeEvaluator::first(&mkey.super_ProString,&pMVar18->project->super_QMakeEvaluator,&fkey);
      ProString::operator=(&ofile,&mkey.super_ProString);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&mkey.super_ProString);
      local_158.size = -0x5555555555555556;
      local_158.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_158.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      ProString::toQString(&mkey.super_ProString.m_string,&ofile);
      Option::fixPathToTargetOS((QString *)&local_158,&mkey.super_ProString.m_string,true,true);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&mkey.super_ProString);
LAB_00153239:
      qVar12 = QString::lastIndexOf((QString *)&local_158,&Option::dir_sep,CaseSensitive);
      if ((int)qVar12 == -1) {
        pSVar21 = pSVar11;
        QString::operator=(&pSVar11->profile,(QString *)&local_158);
      }
      else {
        QString::left(&mkey.super_ProString.m_string,(QString *)&local_158,
                      (qVar12 << 0x20) + 0x100000000 >> 0x20);
        pDVar4 = (pSVar11->in_directory).d.d;
        pcVar16 = (pSVar11->in_directory).d.ptr;
        (pSVar11->in_directory).d.d = mkey.super_ProString.m_string.d.d;
        (pSVar11->in_directory).d.ptr = mkey.super_ProString.m_string.d.ptr;
        qVar12 = (pSVar11->in_directory).d.size;
        (pSVar11->in_directory).d.size = mkey.super_ProString.m_string.d.size;
        pSVar21 = pSVar11;
        mkey.super_ProString.m_string.d.d = pDVar4;
        mkey.super_ProString.m_string.d.ptr = pcVar16;
        mkey.super_ProString.m_string.d.size = qVar12;
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&mkey.super_ProString);
        QString::mid((longlong)&mkey.super_ProString,(longlong)&local_158);
        pDVar4 = (pSVar11->profile).d.d;
        pcVar16 = (pSVar11->profile).d.ptr;
        (pSVar11->profile).d.d = mkey.super_ProString.m_string.d.d;
        (pSVar11->profile).d.ptr = mkey.super_ProString.m_string.d.ptr;
        qVar12 = (pSVar11->profile).d.size;
        (pSVar11->profile).d.size = mkey.super_ProString.m_string.d.size;
        mkey.super_ProString.m_string.d.d = pDVar4;
        mkey.super_ProString.m_string.d.ptr = pcVar16;
        mkey.super_ProString.m_string.d.size = qVar12;
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&mkey.super_ProString);
      }
LAB_0015354a:
      pQVar14 = &pSVar11->in_directory;
      while (cVar9 = QString::endsWith((QString *)pQVar14,0x26bbd0), cVar9 != '\0') {
        QString::chop((longlong)pQVar14);
      }
      local_170.d = (pSVar21->in_directory).d.d;
      local_170.ptr = (pSVar21->in_directory).d.ptr;
      local_170.size = (pSVar21->in_directory).d.size;
      if (local_170.d != (Data *)0x0) {
        LOCK();
        ((local_170.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_170.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      file.d.ptr = (char16_t *)pSVar21;
      file.d.d = (Data *)in_stack_fffffffffffffcc8;
      file.d.size = (qsizetype)this;
      fileInfo((MakefileGenerator *)&mkey,file);
      cVar9 = QFileInfo::isRelative();
      QFileInfo::~QFileInfo((QFileInfo *)&mkey);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
      if (cVar9 == '\0') {
        pMVar18 = this;
        fileFixify((QString *)&mkey,this,pQVar14,(FileFixifyTypes)0x3,true);
        pDVar4 = (pSVar21->out_directory).d.d;
        pcVar16 = (pSVar21->out_directory).d.ptr;
        (pSVar21->out_directory).d.d = mkey.super_ProString.m_string.d.d;
        (pSVar21->out_directory).d.ptr = mkey.super_ProString.m_string.d.ptr;
        qVar12 = (pSVar21->out_directory).d.size;
        (pSVar21->out_directory).d.size = mkey.super_ProString.m_string.d.size;
        mkey.super_ProString.m_string.d.d = pDVar4;
        mkey.super_ProString.m_string.d.ptr = pcVar16;
        mkey.super_ProString.m_string.d.size = qVar12;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&mkey);
      }
      else {
        QString::operator=(&pSVar21->out_directory,(QString *)pQVar14);
        pMVar18 = this;
      }
      mkey.super_ProString.m_file = -0x55555556;
      mkey.super_ProString._36_4_ = 0xaaaaaaaa;
      mkey.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
      mkey.super_ProString.m_string.d.size = -0x5555555555555556;
      mkey.super_ProString.m_offset = -0x55555556;
      mkey.super_ProString.m_length = -0x55555556;
      mkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      mkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      dkey.super_ProString.m_string.d.d = (Data *)&local_a0;
      dkey.super_ProString.m_string.d.ptr = L".makefile";
      ProString::ProString<QString&,char_const(&)[10]>
                ((ProString *)&mkey,
                 (QStringBuilder<QString_&,_const_char_(&)[10]> *)&dkey.super_ProString);
      bVar7 = QMakeProject::isEmpty(this->project,&mkey);
      if (bVar7) {
        pQVar14 = &pSVar21->makefile;
        pSVar11 = pSVar21;
        QString::operator=(pQVar14,"Makefile");
        pQVar5 = &pSVar21->profile;
        pSVar21 = pSVar11;
        if ((pQVar5->d).size != 0) {
          tkey.super_ProString.m_string.d.d = (pSVar11->in_directory).d.d;
          tkey.super_ProString.m_string.d.ptr = (pSVar11->in_directory).d.ptr;
          tkey.super_ProString.m_string.d.size = (pSVar11->in_directory).d.size;
          if (tkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((tkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((tkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          qVar12 = QString::lastIndexOf((QString *)&tkey,&Option::dir_sep,CaseSensitive);
          if ((int)qVar12 != -1) {
            QString::mid((longlong)&dkey.super_ProString,(longlong)&tkey);
            qVar12 = tkey.super_ProString.m_string.d.size;
            pcVar16 = tkey.super_ProString.m_string.d.ptr;
            pDVar4 = tkey.super_ProString.m_string.d.d;
            tkey.super_ProString.m_string.d.d = dkey.super_ProString.m_string.d.d;
            tkey.super_ProString.m_string.d.ptr = dkey.super_ProString.m_string.d.ptr;
            dkey.super_ProString.m_string.d.d = pDVar4;
            dkey.super_ProString.m_string.d.ptr = pcVar16;
            tkey.super_ProString.m_string.d.size = dkey.super_ProString.m_string.d.size;
            dkey.super_ProString.m_string.d.size = qVar12;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&dkey.super_ProString);
          }
          dfkey.super_ProString.m_string.d.ptr = (char16_t *)&Option::pro_ext;
          dfkey.super_ProString.m_string.d.d = (Data *)&tkey;
          QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                    (&dkey.super_ProString.m_string,(QStringBuilder<QString_&,_QString_&> *)&dfkey);
          bVar7 = operator!=(&pSVar11->profile,&dkey.super_ProString.m_string);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&dkey.super_ProString);
          if (bVar7) {
            QString::left((QString *)&dfkey,&pSVar11->profile,
                          (pSVar21->profile).d.size - Option::pro_ext.d.size);
            qVar12 = dfkey.super_ProString.m_string.d.size;
            dkey.super_ProString.m_string.d.size = (qsizetype)dfkey.super_ProString.m_string.d.ptr;
            dkey.super_ProString.m_string.d.ptr = (char16_t *)dfkey.super_ProString.m_string.d.d;
            dkey.super_ProString.m_string.d.d = (Data *)0x2252f2;
            dfkey.super_ProString.m_string.d.d = (Data *)0x0;
            dfkey.super_ProString.m_string.d.ptr = (char16_t *)0x0;
            dfkey.super_ProString.m_string.d.size = 0;
            qVar3 = dfkey.super_ProString.m_string.d.size;
            dfkey.super_ProString.m_string.d.size._0_4_ = (undefined4)qVar12;
            dfkey.super_ProString.m_string.d.size._4_4_ = SUB84(qVar12,4);
            dkey.super_ProString.m_offset = (undefined4)dfkey.super_ProString.m_string.d.size;
            dkey.super_ProString.m_length = dfkey.super_ProString.m_string.d.size._4_4_;
            dfkey.super_ProString.m_string.d.size = qVar3;
            ::operator+=(pQVar14,(QStringBuilder<const_char_(&)[2],_QString> *)&dkey);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&dkey.super_ProString.m_string.d.ptr);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dfkey);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tkey);
        }
      }
      else {
        QMakeEvaluator::first(&dkey.super_ProString,&this->project->super_QMakeEvaluator,&mkey);
        ProString::toQString((QString *)&tkey,&dkey.super_ProString);
        pDVar4 = (pSVar21->makefile).d.d;
        pcVar16 = (pSVar21->makefile).d.ptr;
        (pSVar21->makefile).d.d = tkey.super_ProString.m_string.d.d;
        (pSVar21->makefile).d.ptr = tkey.super_ProString.m_string.d.ptr;
        qVar12 = (pSVar21->makefile).d.size;
        (pSVar21->makefile).d.size = tkey.super_ProString.m_string.d.size;
        tkey.super_ProString.m_string.d.d = pDVar4;
        tkey.super_ProString.m_string.d.ptr = pcVar16;
        tkey.super_ProString.m_string.d.size = qVar12;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tkey);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&dkey.super_ProString);
      }
      dkey.super_ProString.m_file = -0x55555556;
      dkey.super_ProString._36_4_ = 0xaaaaaaaa;
      dkey.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
      dkey.super_ProString.m_string.d.size = -0x5555555555555556;
      dkey.super_ProString.m_offset = -0x55555556;
      dkey.super_ProString.m_length = -0x55555556;
      dkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      dkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      tkey.super_ProString.m_string.d.d = (Data *)&local_a0;
      tkey.super_ProString.m_string.d.ptr = L".depends";
      ProString::ProString<QString&,char_const(&)[9]>
                (&dkey.super_ProString,(QStringBuilder<QString_&,_const_char_(&)[9]> *)&tkey);
      this = pMVar18;
      bVar7 = QMakeProject::isEmpty(pMVar18->project,(ProKey *)&dkey.super_ProString);
      if (!bVar7) {
        pPVar13 = QMakeEvaluator::valuesRef(&pMVar18->project->super_QMakeEvaluator,&dkey);
        this_00 = &pSVar21->depends;
        for (uVar19 = 0; uVar19 < (ulong)(pPVar13->super_QList<ProString>).d.size;
            uVar19 = uVar19 + 1) {
          uVar20 = 0xffffffffffffffff;
          lVar6 = -0x30;
          pMVar18 = this;
          do {
            lVar17 = lVar6;
            uVar20 = uVar20 + 1;
            if ((ulong)(pPVar10->super_QList<ProString>).d.size <= uVar20) {
              dfkey.super_ProString.m_string.d.size = -0x5555555555555556;
              dfkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              dfkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              ProString::toQString
                        ((QString *)&dfkey,(pPVar13->super_QList<ProString>).d.ptr + uVar19);
              QString::QString((QString *)&dskey,"[^a-zA-Z0-9_]");
              QRegularExpression::QRegularExpression
                        ((QRegularExpression *)&local_1c8,(QArrayDataPointer<char16_t> *)&dskey,0);
              QString::QString(&local_2e8.m_string,"-");
              pQVar14 = (QString *)
                        QString::replace((QRegularExpression *)&dfkey,(QString *)&local_1c8);
              ProString::ProString(&tkey.super_ProString,pQVar14);
              QList<ProString>::emplaceBack<ProString>
                        (&this_00->super_QList<ProString>,&tkey.super_ProString);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&tkey.super_ProString);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_2e8);
              QRegularExpression::~QRegularExpression((QRegularExpression *)&local_1c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dskey)
              ;
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dfkey)
              ;
              this = pMVar18;
              goto LAB_00154014;
            }
            bVar7 = ProString::operator==
                              ((ProString *)
                               ((long)&(pPVar10->super_QList<ProString>).d.ptr[1].m_string.d.d +
                               lVar17),(pPVar13->super_QList<ProString>).d.ptr + uVar19);
            lVar6 = lVar17 + 0x30;
          } while (!bVar7);
          local_1c8.size = -0x5555555555555556;
          local_1c8.d._0_4_ = 0xaaaaaaaa;
          local_1c8.d._4_4_ = 0xaaaaaaaa;
          local_1c8.ptr._0_4_ = 0xaaaaaaaa;
          local_1c8.ptr._4_4_ = 0xaaaaaaaa;
          ProString::toQString
                    ((QString *)&local_1c8,
                     (ProString *)
                     ((long)&(pPVar10->super_QList<ProString>).d.ptr[1].m_string.d.d + lVar17));
          local_1e0.d = (Data *)CONCAT44(local_1c8.d._4_4_,local_1c8.d._0_4_);
          local_1e0.ptr = (char16_t *)CONCAT44(local_1c8.ptr._4_4_,local_1c8.ptr._0_4_);
          local_1e0.size = local_1c8.size;
          if (local_1e0.d != (Data *)0x0) {
            LOCK();
            ((local_1e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_1e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QString::QString(&tkey.super_ProString.m_string,"[^a-zA-Z0-9_]");
          QRegularExpression::QRegularExpression
                    ((QRegularExpression *)&dskey.super_ProString,&tkey.super_ProString,0);
          QString::QString(&dfkey.super_ProString.m_string,"-");
          QString::replace((QRegularExpression *)&local_1e0,(QString *)&dskey.super_ProString);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&dfkey.super_ProString);
          QRegularExpression::~QRegularExpression((QRegularExpression *)&dskey.super_ProString);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&tkey.super_ProString);
          tkey.super_ProString.m_file = -0x55555556;
          tkey.super_ProString._36_4_ = 0xaaaaaaaa;
          tkey.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
          tkey.super_ProString.m_string.d.size = -0x5555555555555556;
          tkey.super_ProString.m_offset = -0x55555556;
          tkey.super_ProString.m_length = -0x55555556;
          tkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          tkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          dfkey.super_ProString.m_string.d.ptr = L".target";
          dfkey.super_ProString.m_string.d.d = (Data *)&local_1e0;
          ProString::ProString<QString&,char_const(&)[8]>
                    (&tkey.super_ProString,
                     (QStringBuilder<QString_&,_const_char_(&)[8]> *)&dfkey.super_ProString);
          this = pMVar18;
          bVar7 = QMakeProject::isEmpty(pMVar18->project,&tkey);
          if (bVar7) {
            local_268.size = -0x5555555555555556;
            local_268.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_268.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            Option::fixPathToTargetOS((QString *)&local_268,(QString *)&local_1c8,true,true);
            dfkey.super_ProString.m_file = -0x55555556;
            dfkey.super_ProString._36_4_ = 0xaaaaaaaa;
            dfkey.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
            dfkey.super_ProString.m_string.d.size = -0x5555555555555556;
            dfkey.super_ProString.m_offset = -0x55555556;
            dfkey.super_ProString.m_length = -0x55555556;
            dfkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            dfkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            dskey.super_ProString.m_string.d.ptr = L".file";
            dskey.super_ProString.m_string.d.d = (Data *)&local_1e0;
            ProString::ProString<QString&,char_const(&)[6]>
                      (&dfkey.super_ProString,
                       (QStringBuilder<QString_&,_const_char_(&)[6]> *)&dskey.super_ProString);
            bVar7 = QMakeProject::isEmpty(pMVar18->project,(ProKey *)&dfkey.super_ProString);
            if (bVar7) {
              dskey.super_ProString.m_file = -0x55555556;
              dskey.super_ProString._36_4_ = 0xaaaaaaaa;
              dskey.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
              dskey.super_ProString.m_string.d.size = -0x5555555555555556;
              dskey.super_ProString.m_offset = -0x55555556;
              dskey.super_ProString.m_length = -0x55555556;
              dskey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              dskey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              local_2e8.m_string.d.ptr = L".subdir";
              local_2e8.m_string.d.d = (Data *)&local_1e0;
              ProString::ProString<QString&,char_const(&)[8]>
                        (&dskey.super_ProString,
                         (QStringBuilder<QString_&,_const_char_(&)[8]> *)&local_2e8);
              bVar7 = QMakeProject::isEmpty(pMVar18->project,(ProKey *)&dskey.super_ProString);
              if (!bVar7) {
                QMakeEvaluator::first
                          (&local_2e8,&pMVar18->project->super_QMakeEvaluator,
                           (ProKey *)&dskey.super_ProString);
                ProString::toQString((QString *)&local_2b8,&local_2e8);
                qVar12 = local_268.size;
                pcVar16 = local_268.ptr;
                pDVar4 = local_268.d;
                local_268.d = local_2b8.d;
                local_268.ptr = local_2b8.ptr;
                local_2b8.d = pDVar4;
                local_2b8.ptr = pcVar16;
                local_268.size = local_2b8.size;
                local_2b8.size = qVar12;
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_2e8);
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&dskey.super_ProString);
              pMVar18 = this;
            }
            else {
              QMakeEvaluator::first
                        (&dskey.super_ProString,&pMVar18->project->super_QMakeEvaluator,
                         (ProKey *)&dfkey.super_ProString);
              ProString::toQString(&local_2e8.m_string,&dskey.super_ProString);
              qVar12 = local_268.size;
              pcVar16 = local_268.ptr;
              pDVar4 = local_268.d;
              local_268.d = local_2e8.m_string.d.d;
              local_268.ptr = local_2e8.m_string.d.ptr;
              local_2e8.m_string.d.d = pDVar4;
              local_2e8.m_string.d.ptr = pcVar16;
              local_268.size = local_2e8.m_string.d.size;
              local_2e8.m_string.d.size = qVar12;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_2e8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&dskey.super_ProString);
              pMVar18 = this;
            }
            QString::QString(&local_2e8.m_string,"[^a-zA-Z0-9_]");
            QRegularExpression::QRegularExpression(local_300,&local_2e8,0);
            QString::QString((QString *)&local_2b8,"-");
            local_2f8.b = (QString *)
                          QString::replace((QRegularExpression *)&local_268,(QString *)local_300);
            local_2f8.a = (char (*) [5])0x21b349;
            ProString::ProString<char_const(&)[5],QString&>(&dskey.super_ProString,&local_2f8);
            QList<ProString>::emplaceBack<ProString>
                      (&this_00->super_QList<ProString>,&dskey.super_ProString);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&dskey.super_ProString);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
            QRegularExpression::~QRegularExpression(local_300);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_2e8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dfkey);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_268);
            this = pMVar18;
          }
          else {
            QMakeEvaluator::first
                      (&dfkey.super_ProString,&pMVar18->project->super_QMakeEvaluator,&tkey);
            QList<ProString>::emplaceBack<ProString>
                      (&this_00->super_QList<ProString>,&dfkey.super_ProString);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&dfkey.super_ProString);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tkey);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
LAB_00154014:
        }
      }
      tkey.super_ProString.m_file = -0x55555556;
      tkey.super_ProString._36_4_ = 0xaaaaaaaa;
      tkey.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
      tkey.super_ProString.m_string.d.size = -0x5555555555555556;
      tkey.super_ProString.m_offset = -0x55555556;
      tkey.super_ProString.m_length = -0x55555556;
      tkey.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      tkey.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      dfkey.super_ProString.m_string.d.d = (Data *)&local_a0;
      dfkey.super_ProString.m_string.d.ptr = L".target";
      ProString::ProString<QString&,char_const(&)[8]>
                (&tkey.super_ProString,
                 (QStringBuilder<QString_&,_const_char_(&)[8]> *)&dfkey.super_ProString);
      bVar7 = QMakeProject::isEmpty(pMVar18->project,(ProKey *)&tkey.super_ProString);
      if (bVar7) {
        dskey.super_ProString.m_string.d.d = (Data *)anon_var_dwarf_c534f;
        dskey.super_ProString.m_string.d.ptr = (char16_t *)&local_158;
        QStringBuilder<const_char_(&)[5],_QString_&>::convertTo<QString>
                  (&dfkey.super_ProString.m_string,
                   (QStringBuilder<const_char_(&)[5],_QString_&> *)&dskey);
        pDVar4 = (pSVar21->target).d.d;
        pcVar16 = (pSVar21->target).d.ptr;
        (pSVar21->target).d.d = dfkey.super_ProString.m_string.d.d;
        (pSVar21->target).d.ptr = dfkey.super_ProString.m_string.d.ptr;
        qVar12 = (pSVar21->target).d.size;
        (pSVar21->target).d.size = dfkey.super_ProString.m_string.d.size;
        dfkey.super_ProString.m_string.d.d = pDVar4;
        dfkey.super_ProString.m_string.d.ptr = pcVar16;
        dfkey.super_ProString.m_string.d.size = qVar12;
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&dfkey.super_ProString);
        QString::QString(&dfkey.super_ProString.m_string,"[^a-zA-Z0-9_]");
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)&local_2e8,&dfkey.super_ProString,0);
        QString::QString((QString *)&dskey,"-");
        QString::replace((QRegularExpression *)&pSVar21->target,(QString *)&local_2e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dskey);
        QRegularExpression::~QRegularExpression((QRegularExpression *)&local_2e8);
      }
      else {
        QMakeEvaluator::first
                  (&dfkey.super_ProString,&pMVar18->project->super_QMakeEvaluator,
                   (ProKey *)&tkey.super_ProString);
        ProString::toQString((QString *)&dskey,&dfkey.super_ProString);
        pDVar4 = (pSVar21->target).d.d;
        pcVar16 = (pSVar21->target).d.ptr;
        (pSVar21->target).d.d = dskey.super_ProString.m_string.d.d;
        (pSVar21->target).d.ptr = dskey.super_ProString.m_string.d.ptr;
        qVar12 = (pSVar21->target).d.size;
        (pSVar21->target).d.size = dskey.super_ProString.m_string.d.size;
        dskey.super_ProString.m_string.d.d = pDVar4;
        dskey.super_ProString.m_string.d.ptr = pcVar16;
        dskey.super_ProString.m_string.d.size = qVar12;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dskey);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&dfkey.super_ProString);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&tkey.super_ProString);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&dkey);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&mkey);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&skey);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fkey);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ofile);
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

QList<MakefileGenerator::SubTarget*>
MakefileGenerator::findSubDirsSubTargets() const
{
    QList<SubTarget*> targets;
    {
        const ProStringList &subdirs = project->values("SUBDIRS");
        for(int subdir = 0; subdir < subdirs.size(); ++subdir) {
            ProString ofile = subdirs[subdir];
            QString oname = ofile.toQString();
            QString fixedSubdir = oname;
            fixedSubdir.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");

            SubTarget *st = new SubTarget;
            st->name = oname;
            targets.append(st);

            bool fromFile = false;
            const ProKey fkey(fixedSubdir + ".file");
            const ProKey skey(fixedSubdir + ".subdir");
            if (!project->isEmpty(fkey)) {
                if (!project->isEmpty(skey))
                    warn_msg(WarnLogic, "Cannot assign both file and subdir for subdir %s",
                             subdirs[subdir].toLatin1().constData());
                ofile = project->first(fkey);
                fromFile = true;
            } else if (!project->isEmpty(skey)) {
                ofile = project->first(skey);
                fromFile = false;
            } else {
                fromFile = ofile.endsWith(Option::pro_ext);
            }
            QString file = Option::fixPathToTargetOS(ofile.toQString());

            if(fromFile) {
                int slsh = file.lastIndexOf(Option::dir_sep);
                if(slsh != -1) {
                    st->in_directory = file.left(slsh+1);
                    st->profile = file.mid(slsh+1);
                } else {
                    st->profile = file;
                }
            } else {
                if (!file.isEmpty() && !project->isActiveConfig("subdir_first_pro")) {
                    const QString baseName = file.section(Option::dir_sep, -1);
                    if (baseName.isEmpty()) {
                        warn_msg(WarnLogic, "Ignoring invalid SUBDIRS entry %s",
                                 subdirs[subdir].toLatin1().constData());
                        continue;
                    }
                    st->profile = baseName + Option::pro_ext;
                }
                st->in_directory = file;
            }
            while(st->in_directory.endsWith(Option::dir_sep))
                st->in_directory.chop(1);
            if(fileInfo(st->in_directory).isRelative())
                st->out_directory = st->in_directory;
            else
                st->out_directory = fileFixify(st->in_directory, FileFixifyBackwards);
            const ProKey mkey(fixedSubdir + ".makefile");
            if (!project->isEmpty(mkey)) {
                st->makefile = project->first(mkey).toQString();
            } else {
                st->makefile = "Makefile";
                if(!st->profile.isEmpty()) {
                    QString basename = st->in_directory;
                    int new_slsh = basename.lastIndexOf(Option::dir_sep);
                    if(new_slsh != -1)
                        basename = basename.mid(new_slsh+1);
                    if(st->profile != basename + Option::pro_ext)
                        st->makefile += "." + st->profile.left(st->profile.size() - Option::pro_ext.size());
                }
            }
            const ProKey dkey(fixedSubdir + ".depends");
            if (!project->isEmpty(dkey)) {
                const ProStringList &depends = project->values(dkey);
                for(int depend = 0; depend < depends.size(); ++depend) {
                    bool found = false;
                    for(int subDep = 0; subDep < subdirs.size(); ++subDep) {
                        if(subdirs[subDep] == depends.at(depend)) {
                            QString subName = subdirs[subDep].toQString();
                            QString fixedSubDep = subName;
                            fixedSubDep.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");
                            const ProKey dtkey(fixedSubDep + ".target");
                            if (!project->isEmpty(dtkey)) {
                                st->depends += project->first(dtkey);
                            } else {
                                QString d = Option::fixPathToTargetOS(subName);
                                const ProKey dfkey(fixedSubDep + ".file");
                                if (!project->isEmpty(dfkey)) {
                                    d = project->first(dfkey).toQString();
                                } else {
                                    const ProKey dskey(fixedSubDep + ".subdir");
                                    if (!project->isEmpty(dskey))
                                        d = project->first(dskey).toQString();
                                }
                                st->depends += "sub-" + d.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");
                            }
                            found = true;
                            break;
                        }
                    }
                    if(!found) {
                        QString depend_str = depends.at(depend).toQString();
                        st->depends += depend_str.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");
                    }
                }
            }
            const ProKey tkey(fixedSubdir + ".target");
            if (!project->isEmpty(tkey)) {
                st->target = project->first(tkey).toQString();
            } else {
                st->target = "sub-" + file;
                st->target.replace(QRegularExpression("[^a-zA-Z0-9_]"), "-");
            }
        }
    }
    return targets;
}